

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O3

PolarSpeakerPosition * __thiscall
ear::GainCalculatorDirectSpeakersImpl::_applyScreenEdgeLock
          (PolarSpeakerPosition *__return_storage_ptr__,GainCalculatorDirectSpeakersImpl *this,
          PolarSpeakerPosition *pos)

{
  undefined8 *puVar1;
  double azimuth;
  double elevation;
  type tVar2;
  undefined8 uVar3;
  type tVar4;
  long lVar5;
  PolarSpeakerPosition *pPVar6;
  PolarSpeakerPosition *pPVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  pair<double,_double> pVar11;
  undefined1 local_70 [8];
  dummy_u local_68;
  bool local_48;
  dummy_u local_40;
  
  bVar10 = 0;
  azimuth = pos->azimuth;
  elevation = pos->elevation;
  local_70[0] = false;
  bVar8 = (pos->screenEdgeLock).horizontal.super_type.m_initialized == true;
  if (bVar8) {
    local_68.aligner_ = (type)((long)local_70 + 0x18);
    tVar2 = (pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_.aligner_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_70 + 8),tVar2,
               *(long *)((long)&(pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_ + 8) +
               (long)tVar2);
  }
  local_48 = false;
  bVar9 = (pos->screenEdgeLock).vertical.super_type.m_initialized == true;
  local_70[0] = bVar8;
  if (bVar9) {
    local_40.aligner_ = (type)((long)local_70 + 0x40);
    tVar2 = (pos->screenEdgeLock).vertical.super_type.m_storage.dummy_.aligner_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_70 + 0x30),tVar2,
               *(long *)((long)&(pos->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 8) +
               (long)tVar2);
  }
  local_48 = bVar9;
  pVar11 = ScreenEdgeLockHandler::handleAzimuthElevation
                     (&this->_screenEdgeLockHandler,azimuth,elevation,(ScreenEdgeLock *)local_70);
  pos->azimuth = pVar11.first;
  pos->elevation = pVar11.second;
  if (local_48 == true) {
    if (local_40.aligner_ != (type)((long)local_70 + 0x40)) {
      operator_delete((void *)local_40.aligner_,local_40._16_8_ + 1);
    }
    local_48 = false;
  }
  if ((local_70[0] == true) && (local_68.aligner_ != (type)((long)local_70 + 0x18))) {
    operator_delete((void *)local_68.aligner_,local_68._16_8_ + 1);
  }
  pPVar6 = pos;
  pPVar7 = __return_storage_ptr__;
  for (lVar5 = 0xf; lVar5 != 0; lVar5 = lVar5 + -1) {
    pPVar7->azimuth = pPVar6->azimuth;
    pPVar6 = (PolarSpeakerPosition *)((long)pPVar6 + (ulong)bVar10 * -0x10 + 8);
    pPVar7 = (PolarSpeakerPosition *)((long)pPVar7 + (ulong)bVar10 * -0x10 + 8);
  }
  (__return_storage_ptr__->screenEdgeLock).horizontal.super_type.m_initialized = false;
  if ((pos->screenEdgeLock).horizontal.super_type.m_initialized == true) {
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->screenEdgeLock).horizontal.super_type.m_storage.dummy_
             + 0x10);
    *(undefined8 **)&(__return_storage_ptr__->screenEdgeLock).horizontal.super_type.m_storage.dummy_
         = puVar1;
    tVar2 = (pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_.aligner_;
    tVar4 = (type)((long)&(pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_ + 0x10);
    if (tVar2 == tVar4) {
      uVar3 = *(undefined8 *)
               ((long)&(pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_ + 0x18);
      *puVar1 = *(undefined8 *)tVar4;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->screenEdgeLock).horizontal.super_type.m_storage.dummy_ +
       0x18) = uVar3;
    }
    else {
      (__return_storage_ptr__->screenEdgeLock).horizontal.super_type.m_storage.dummy_.aligner_ =
           tVar2;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->screenEdgeLock).horizontal.super_type.m_storage.dummy_ +
       0x10) = *(undefined8 *)tVar4;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->screenEdgeLock).horizontal.super_type.m_storage.dummy_ + 8) =
         *(undefined8 *)((long)&(pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_ + 8);
    *(type *)&(pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_ = tVar4;
    *(undefined8 *)((long)&(pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_ + 8) = 0;
    (pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_.data[0x10] = '\0';
    (__return_storage_ptr__->screenEdgeLock).horizontal.super_type.m_initialized = true;
  }
  (__return_storage_ptr__->screenEdgeLock).vertical.super_type.m_initialized = false;
  if ((pos->screenEdgeLock).vertical.super_type.m_initialized == true) {
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->screenEdgeLock).vertical.super_type.m_storage.dummy_ +
             0x10);
    *(undefined8 **)&(__return_storage_ptr__->screenEdgeLock).vertical.super_type.m_storage.dummy_ =
         puVar1;
    tVar2 = (pos->screenEdgeLock).vertical.super_type.m_storage.dummy_.aligner_;
    tVar4 = (type)((long)&(pos->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 0x10);
    if (tVar2 == tVar4) {
      uVar3 = *(undefined8 *)
               ((long)&(pos->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 0x18);
      *puVar1 = *(undefined8 *)tVar4;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 0x18)
           = uVar3;
    }
    else {
      (__return_storage_ptr__->screenEdgeLock).vertical.super_type.m_storage.dummy_.aligner_ = tVar2
      ;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 0x10)
           = *(undefined8 *)tVar4;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 8) =
         *(undefined8 *)((long)&(pos->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 8);
    *(type *)&(pos->screenEdgeLock).vertical.super_type.m_storage.dummy_ = tVar4;
    *(undefined8 *)((long)&(pos->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 8) = 0;
    (pos->screenEdgeLock).vertical.super_type.m_storage.dummy_.data[0x10] = '\0';
    (__return_storage_ptr__->screenEdgeLock).vertical.super_type.m_initialized = true;
  }
  return __return_storage_ptr__;
}

Assistant:

PolarSpeakerPosition GainCalculatorDirectSpeakersImpl::_applyScreenEdgeLock(
      PolarSpeakerPosition pos) {
    std::tie(pos.azimuth, pos.elevation) =
        _screenEdgeLockHandler.handleAzimuthElevation(
            pos.azimuth, pos.elevation, pos.screenEdgeLock);
    return pos;
  }